

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O1

Index * __thiscall verilogAST::Index::clone_impl(Index *this)

{
  int iVar1;
  Index *pIVar2;
  undefined4 extraout_var;
  anon_class_1_0_00000001 local_29;
  _Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  local_28;
  
  pIVar2 = (Index *)operator_new(0x20);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/include/verilogAST.hpp:255:9)_&&,_const_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_&>
    ::_S_vtable._M_arr
    [(this->value).
     super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
     .
     super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     ._M_index]._M_data)
            ((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)&local_28,&local_29,&this->value);
  iVar1 = (*(((this->index)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  (pIVar2->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__00176660
  ;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
                     *)&pIVar2->value,&local_28);
  (pIVar2->index)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var,iVar1);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>_&>
    ::_S_vtable._M_arr
    [local_28.
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Index>_>
     ._M_index]._M_data)
            (&local_29,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
              *)&local_28);
  return pIVar2;
}

Assistant:

virtual Index* clone_impl() const override {
    return new Index(this->clone_index_value(), this->index->clone());
  }